

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O2

void __thiscall IR::Print::visit(Print *this,Exp *e)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((e->super_tuple<const_IR::Expr_*>).super__Tuple_impl<0UL,_const_IR::Expr_*>.
             super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[5])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    fmt::v7::print<char[6],std::__cxx11::string_const&,char>
              (this->out,(char (*) [6])"\t{0};",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT44(extraout_var,iVar1) + 0x10));
    std::endl<char,std::char_traits<char>>(this->out);
    return;
  }
  __assert_fail("!\"unreachable\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/ir-print.cc"
                ,0x3d,"virtual void IR::Print::visit(IR::Exp *)");
}

Assistant:

void Print::visit(IR::Exp* e) {
  if (auto code = e->expr()->asCode()) {
    fmt::print(out, "\t{0};", code->text());
    out << std::endl;
  } else {
    assert(!"unreachable");
  }
}